

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3Fts3ExprFree(Fts3Expr *pDel)

{
  Fts3Phrase *pFVar1;
  Fts3MultiSegReader *pCsr;
  Fts3Expr *pFVar2;
  Fts3Expr *pFVar3;
  Fts3Expr *p_00;
  long lVar4;
  Fts3Expr *p;
  Fts3MultiSegReader **ppFVar5;
  bool bVar6;
  
  if (pDel != (Fts3Expr *)0x0) {
    do {
      do {
        p_00 = pDel;
        pDel = p_00->pLeft;
      } while (p_00->pLeft != (Fts3Expr *)0x0);
      pDel = p_00->pRight;
    } while (p_00->pRight != (Fts3Expr *)0x0);
    while( true ) {
      pFVar3 = p_00->pParent;
      pFVar1 = p_00->pPhrase;
      if (pFVar1 != (Fts3Phrase *)0x0) {
        sqlite3_free((pFVar1->doclist).aAll);
        if ((pFVar1->doclist).bFreeList != 0) {
          sqlite3_free((pFVar1->doclist).pList);
        }
        *(undefined8 *)&(pFVar1->doclist).bFreeList = 0;
        (pFVar1->doclist).pList = (char *)0x0;
        (pFVar1->doclist).pNextDocid = (char *)0x0;
        (pFVar1->doclist).iDocid = 0;
        (pFVar1->doclist).aAll = (char *)0x0;
        *(undefined8 *)&(pFVar1->doclist).nAll = 0;
        *(undefined8 *)&(pFVar1->doclist).nList = 0;
        if (0 < pFVar1->nToken) {
          ppFVar5 = &pFVar1->aToken[0].pSegcsr;
          lVar4 = 0;
          do {
            pCsr = *ppFVar5;
            sqlite3Fts3SegReaderFinish(pCsr);
            sqlite3_free(pCsr);
            *ppFVar5 = (Fts3MultiSegReader *)0x0;
            lVar4 = lVar4 + 1;
            ppFVar5 = ppFVar5 + 5;
          } while (lVar4 < pFVar1->nToken);
        }
      }
      sqlite3_free(p_00->aMI);
      sqlite3_free(p_00);
      if (pFVar3 == (Fts3Expr *)0x0) break;
      bVar6 = p_00 == pFVar3->pLeft;
      p_00 = pFVar3;
      if (bVar6) {
        pFVar2 = pFVar3->pRight;
        while (p_00 = pFVar3, pFVar2 != (Fts3Expr *)0x0) {
          do {
            pFVar3 = pFVar2;
            pFVar2 = pFVar3->pLeft;
          } while (pFVar3->pLeft != (Fts3Expr *)0x0);
          pFVar2 = pFVar3->pRight;
        }
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Fts3ExprFree(Fts3Expr *pDel){
  Fts3Expr *p;
  assert( pDel==0 || pDel->pParent==0 );
  for(p=pDel; p && (p->pLeft||p->pRight); p=(p->pLeft ? p->pLeft : p->pRight)){
    assert( p->pParent==0 || p==p->pParent->pRight || p==p->pParent->pLeft );
  }
  while( p ){
    Fts3Expr *pParent = p->pParent;
    fts3FreeExprNode(p);
    if( pParent && p==pParent->pLeft && pParent->pRight ){
      p = pParent->pRight;
      while( p && (p->pLeft || p->pRight) ){
        assert( p==p->pParent->pRight || p==p->pParent->pLeft );
        p = (p->pLeft ? p->pLeft : p->pRight);
      }
    }else{
      p = pParent;
    }
  }
}